

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3IndexedByLookup(Parse *pParse,SrcList_item *pFrom)

{
  char *zRight;
  int iVar1;
  Index *pIVar2;
  
  iVar1 = 0;
  if ((pFrom->pTab != (Table *)0x0) && (iVar1 = 0, ((pFrom->fg).field_0x1 & 2) != 0)) {
    zRight = (pFrom->u1).zIndexedBy;
    for (pIVar2 = pFrom->pTab->pIndex; pIVar2 != (Index *)0x0; pIVar2 = pIVar2->pNext) {
      iVar1 = sqlite3StrICmp(pIVar2->zName,zRight);
      if (iVar1 == 0) {
        pFrom->pIBIndex = pIVar2;
        return 0;
      }
    }
    sqlite3ErrorMsg(pParse,"no such index: %s",zRight,0);
    pParse->checkSchema = '\x01';
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, struct SrcList_item *pFrom){
  if( pFrom->pTab && pFrom->fg.isIndexedBy ){
    Table *pTab = pFrom->pTab;
    char *zIndexedBy = pFrom->u1.zIndexedBy;
    Index *pIdx;
    for(pIdx=pTab->pIndex; 
        pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy); 
        pIdx=pIdx->pNext
    );
    if( !pIdx ){
      sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
      pParse->checkSchema = 1;
      return SQLITE_ERROR;
    }
    pFrom->pIBIndex = pIdx;
  }
  return SQLITE_OK;
}